

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O2

void __thiscall trng::xoshiro256plus::status_type::status_type(status_type *this,uint i)

{
  byte bVar1;
  
  this->r[2] = 0;
  this->r[3] = 0;
  this->r[0] = 0x8000000000000000;
  this->r[1] = 0;
  bVar1 = (byte)i;
  if ((int)i < 0x40) {
    this->r[0] = 0x8000000000000000 >> (bVar1 & 0x3f);
    this->r[1] = 0;
    this->r[2] = 0;
  }
  else {
    if (i < 0x80) {
      this->r[0] = 0;
      this->r[1] = 0x8000000000000000 >> (bVar1 & 0x3f);
      this->r[2] = 0;
      this->r[3] = 0;
      return;
    }
    if (0xbf < i) {
      this->r[0] = 0;
      this->r[1] = 0;
      this->r[2] = 0;
      this->r[3] = 0x8000000000000000 >> (bVar1 & 0x3f);
      return;
    }
    this->r[0] = 0;
    this->r[1] = 0;
    this->r[2] = 0x8000000000000000 >> (bVar1 & 0x3f);
  }
  this->r[3] = 0;
  return;
}

Assistant:

explicit status_type(int i, eye) : status_type() {
        const result_type mask{result_type(1) << 63};
        if (i < 64)
          *this = status_type{mask >> i, 0, 0, 0};
        else if (i < 2 * 64)
          *this = status_type{0, mask >> (i - 64), 0, 0};
        else if (i < 3 * 64)
          *this = status_type{0, 0, mask >> (i - 2 * 64), 0};
        else
          *this = status_type{0, 0, 0, mask >> (i - 3 * 64)};
      }